

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O1

void handle_fpfpcvt(DisasContext_conflict1 *s,int rd,int rn,int opcode,_Bool itof,int rmode,
                   int scale,int sf,int type)

{
  TCGv_ptr pTVar1;
  TCGContext_conflict1 *tcg_ctx;
  int iVar2;
  TCGv_ptr pTVar3;
  TCGv_i32 pTVar4;
  TCGv_i64 pTVar5;
  TCGv_i32 pTVar6;
  TCGTemp *pTVar7;
  TCGTemp *pTVar8;
  uintptr_t o;
  int iVar9;
  code *pcVar10;
  undefined7 in_register_00000081;
  TCGv_i64 pTVar11;
  TCGTemp *local_58;
  TCGv_ptr local_50;
  TCGv_ptr local_48;
  TCGv_i64 local_40;
  int local_34;
  
  tcg_ctx = s->uc->tcg_ctx;
  local_34 = rn;
  pTVar3 = get_fpstatus_ptr_aarch64(tcg_ctx,type == 3);
  pTVar4 = tcg_const_i32_aarch64(tcg_ctx,0x40 - scale);
  iVar9 = local_34;
  if ((int)CONCAT71(in_register_00000081,itof) == 0) {
    local_40 = cpu_reg_aarch64(s,rd);
    iVar2 = 4;
    if ((opcode & 4U) == 0) {
      iVar2 = rmode;
    }
    iVar2 = arm_rmode_to_sf_aarch64(iVar2);
    pTVar6 = tcg_const_i32_aarch64(tcg_ctx,iVar2);
    pTVar7 = (TCGTemp *)(pTVar6 + (long)tcg_ctx);
    pTVar1 = pTVar3 + (long)&tcg_ctx->pool_cur;
    local_58 = pTVar7;
    local_50 = pTVar1;
    tcg_gen_callN_aarch64(tcg_ctx,helper_set_rmode_aarch64,pTVar7,2,&local_58);
    local_48 = pTVar1;
    if (type == 0) {
      pTVar5 = (TCGv_i64)read_fp_sreg(s,iVar9);
      if (sf != 0) {
        local_58 = (TCGTemp *)((TCGv_i32)pTVar5 + (long)tcg_ctx);
        pTVar8 = (TCGTemp *)(local_40 + (long)tcg_ctx);
        if ((opcode & 1U) == 0) {
          pcVar10 = helper_vfp_tosqs_aarch64;
        }
        else {
          pcVar10 = helper_vfp_touqs_aarch64;
        }
        goto LAB_006a6c54;
      }
      pTVar8 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
      pTVar6 = (TCGv_i32)((long)pTVar8 - (long)tcg_ctx);
      local_58 = (TCGTemp *)((TCGv_i32)pTVar5 + (long)tcg_ctx);
      if ((opcode & 1U) == 0) {
        pcVar10 = helper_vfp_tosls_aarch64;
      }
      else {
        pcVar10 = helper_vfp_touls_aarch64;
      }
LAB_006a6c94:
      local_50 = (TCGv_ptr)(pTVar4 + (long)tcg_ctx);
      tcg_gen_callN_aarch64(tcg_ctx,pcVar10,pTVar8,3,&local_58);
      tcg_gen_extu_i32_i64_aarch64(tcg_ctx,local_40,pTVar6);
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar6 + (long)tcg_ctx));
    }
    else if (type == 3) {
      pTVar5 = (TCGv_i64)read_fp_sreg(s,iVar9);
      if (sf == 0) {
        pTVar8 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
        pTVar6 = (TCGv_i32)((long)pTVar8 - (long)tcg_ctx);
        local_58 = (TCGTemp *)((TCGv_i32)pTVar5 + (long)tcg_ctx);
        if ((opcode & 1U) == 0) {
          pcVar10 = helper_vfp_toslh_aarch64;
        }
        else {
          pcVar10 = helper_vfp_toulh_aarch64;
        }
        goto LAB_006a6c94;
      }
      local_58 = (TCGTemp *)((TCGv_i32)pTVar5 + (long)tcg_ctx);
      pTVar8 = (TCGTemp *)(local_40 + (long)tcg_ctx);
      if ((opcode & 1U) == 0) {
        pcVar10 = helper_vfp_tosqh_aarch64;
      }
      else {
        pcVar10 = helper_vfp_touqh_aarch64;
      }
LAB_006a6c54:
      local_50 = (TCGv_ptr)(pTVar4 + (long)tcg_ctx);
      tcg_gen_callN_aarch64(tcg_ctx,pcVar10,pTVar8,3,&local_58);
    }
    else {
      if (type != 1) {
        iVar9 = 0x1aba;
        goto LAB_006a6d9a;
      }
      pTVar5 = read_fp_dreg(s,iVar9);
      pTVar11 = local_40;
      local_58 = (TCGTemp *)(pTVar5 + (long)&tcg_ctx->pool_cur);
      local_50 = (TCGv_ptr)(pTVar4 + (long)tcg_ctx);
      if ((opcode & 1U) == 0) {
        if (sf == 0) {
          pcVar10 = helper_vfp_tosld_aarch64;
        }
        else {
          pcVar10 = helper_vfp_tosqd_aarch64;
        }
      }
      else if (sf == 0) {
        pcVar10 = helper_vfp_tould_aarch64;
      }
      else {
        pcVar10 = helper_vfp_touqd_aarch64;
      }
      tcg_gen_callN_aarch64(tcg_ctx,pcVar10,(TCGTemp *)(local_40 + (long)tcg_ctx),3,&local_58);
      if (sf == 0) {
        tcg_gen_ext32u_i64_aarch64(tcg_ctx,pTVar11,pTVar11);
      }
    }
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar5 + (long)tcg_ctx));
    local_58 = pTVar7;
    local_50 = pTVar1;
    tcg_gen_callN_aarch64(tcg_ctx,helper_set_rmode_aarch64,pTVar7,2,&local_58);
    goto LAB_006a6d4e;
  }
  pTVar5 = cpu_reg_aarch64(s,local_34);
  if (sf == 0) {
    pTVar11 = new_tmp_a64_aarch64(s);
    if ((opcode & 1U) == 0) {
      tcg_gen_ext32s_i64_aarch64(tcg_ctx,pTVar11,pTVar5);
      pTVar5 = pTVar11;
    }
    else {
      tcg_gen_ext32u_i64_aarch64(tcg_ctx,pTVar11,pTVar5);
      pTVar5 = pTVar11;
    }
  }
  if (type == 0) {
    pTVar7 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
    pTVar11 = (TCGv_i64)((long)pTVar7 - (long)tcg_ctx);
    if ((opcode & 1U) == 0) {
      pcVar10 = helper_vfp_sqtos_aarch64;
    }
    else {
      pcVar10 = helper_vfp_uqtos_aarch64;
    }
LAB_006a6b04:
    local_48 = pTVar3 + (long)&tcg_ctx->pool_cur;
    local_50 = (TCGv_ptr)(pTVar4 + (long)&tcg_ctx->pool_cur);
    local_58 = (TCGTemp *)(pTVar5 + (long)tcg_ctx);
    tcg_gen_callN_aarch64(tcg_ctx,pcVar10,pTVar7,3,&local_58);
    write_fp_sreg(s,rd,(TCGv_i32)pTVar11);
  }
  else {
    if (type == 3) {
      pTVar7 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
      pTVar11 = (TCGv_i64)((long)pTVar7 - (long)tcg_ctx);
      if ((opcode & 1U) == 0) {
        pcVar10 = helper_vfp_sqtoh_aarch64;
      }
      else {
        pcVar10 = helper_vfp_uqtoh_aarch64;
      }
      goto LAB_006a6b04;
    }
    if (type != 1) {
      iVar9 = 0x1a5c;
LAB_006a6d9a:
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                 ,iVar9,(char *)0x0);
    }
    pTVar7 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I64,false);
    pTVar11 = (TCGv_i64)((long)pTVar7 - (long)tcg_ctx);
    local_58 = (TCGTemp *)(pTVar5 + (long)tcg_ctx);
    local_50 = (TCGv_ptr)(pTVar4 + (long)&tcg_ctx->pool_cur);
    local_48 = pTVar3 + (long)&tcg_ctx->pool_cur;
    if ((opcode & 1U) == 0) {
      pcVar10 = helper_vfp_sqtod_aarch64;
    }
    else {
      pcVar10 = helper_vfp_uqtod_aarch64;
    }
    tcg_gen_callN_aarch64(tcg_ctx,pcVar10,pTVar7,3,&local_58);
    write_fp_dreg_aarch64(s,rd,pTVar11);
  }
  pTVar7 = (TCGTemp *)(pTVar11 + (long)tcg_ctx);
LAB_006a6d4e:
  tcg_temp_free_internal_aarch64(tcg_ctx,pTVar7);
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar4 + (long)tcg_ctx));
  return;
}

Assistant:

static void handle_fpfpcvt(DisasContext *s, int rd, int rn, int opcode,
                           bool itof, int rmode, int scale, int sf, int type)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    bool is_signed = !(opcode & 1);
    TCGv_ptr tcg_fpstatus;
    TCGv_i32 tcg_shift, tcg_single;
    TCGv_i64 tcg_double;

    tcg_fpstatus = get_fpstatus_ptr(tcg_ctx, type == 3);

    tcg_shift = tcg_const_i32(tcg_ctx, 64 - scale);

    if (itof) {
        TCGv_i64 tcg_int = cpu_reg(s, rn);
        if (!sf) {
            TCGv_i64 tcg_extend = new_tmp_a64(s);

            if (is_signed) {
                tcg_gen_ext32s_i64(tcg_ctx, tcg_extend, tcg_int);
            } else {
                tcg_gen_ext32u_i64(tcg_ctx, tcg_extend, tcg_int);
            }

            tcg_int = tcg_extend;
        }

        switch (type) {
        case 1: /* float64 */
            tcg_double = tcg_temp_new_i64(tcg_ctx);
            if (is_signed) {
                gen_helper_vfp_sqtod(tcg_ctx, tcg_double, tcg_int,
                                     tcg_shift, tcg_fpstatus);
            } else {
                gen_helper_vfp_uqtod(tcg_ctx, tcg_double, tcg_int,
                                     tcg_shift, tcg_fpstatus);
            }
            write_fp_dreg(s, rd, tcg_double);
            tcg_temp_free_i64(tcg_ctx, tcg_double);
            break;

        case 0: /* float32 */
            tcg_single = tcg_temp_new_i32(tcg_ctx);
            if (is_signed) {
                gen_helper_vfp_sqtos(tcg_ctx, tcg_single, tcg_int,
                                     tcg_shift, tcg_fpstatus);
            } else {
                gen_helper_vfp_uqtos(tcg_ctx, tcg_single, tcg_int,
                                     tcg_shift, tcg_fpstatus);
            }
            write_fp_sreg(s, rd, tcg_single);
            tcg_temp_free_i32(tcg_ctx, tcg_single);
            break;

        case 3: /* float16 */
            tcg_single = tcg_temp_new_i32(tcg_ctx);
            if (is_signed) {
                gen_helper_vfp_sqtoh(tcg_ctx, tcg_single, tcg_int,
                                     tcg_shift, tcg_fpstatus);
            } else {
                gen_helper_vfp_uqtoh(tcg_ctx, tcg_single, tcg_int,
                                     tcg_shift, tcg_fpstatus);
            }
            write_fp_sreg(s, rd, tcg_single);
            tcg_temp_free_i32(tcg_ctx, tcg_single);
            break;

        default:
            g_assert_not_reached();
        }
    } else {
        TCGv_i64 tcg_int = cpu_reg(s, rd);
        TCGv_i32 tcg_rmode;

        if (extract32(opcode, 2, 1)) {
            /* There are too many rounding modes to all fit into rmode,
             * so FCVTA[US] is a special case.
             */
            rmode = FPROUNDING_TIEAWAY;
        }

        tcg_rmode = tcg_const_i32(tcg_ctx, arm_rmode_to_sf(rmode));

        gen_helper_set_rmode(tcg_ctx, tcg_rmode, tcg_rmode, tcg_fpstatus);

        switch (type) {
        case 1: /* float64 */
            tcg_double = read_fp_dreg(s, rn);
            if (is_signed) {
                if (!sf) {
                    gen_helper_vfp_tosld(tcg_ctx, tcg_int, tcg_double,
                                         tcg_shift, tcg_fpstatus);
                } else {
                    gen_helper_vfp_tosqd(tcg_ctx, tcg_int, tcg_double,
                                         tcg_shift, tcg_fpstatus);
                }
            } else {
                if (!sf) {
                    gen_helper_vfp_tould(tcg_ctx, tcg_int, tcg_double,
                                         tcg_shift, tcg_fpstatus);
                } else {
                    gen_helper_vfp_touqd(tcg_ctx, tcg_int, tcg_double,
                                         tcg_shift, tcg_fpstatus);
                }
            }
            if (!sf) {
                tcg_gen_ext32u_i64(tcg_ctx, tcg_int, tcg_int);
            }
            tcg_temp_free_i64(tcg_ctx, tcg_double);
            break;

        case 0: /* float32 */
            tcg_single = read_fp_sreg(s, rn);
            if (sf) {
                if (is_signed) {
                    gen_helper_vfp_tosqs(tcg_ctx, tcg_int, tcg_single,
                                         tcg_shift, tcg_fpstatus);
                } else {
                    gen_helper_vfp_touqs(tcg_ctx, tcg_int, tcg_single,
                                         tcg_shift, tcg_fpstatus);
                }
            } else {
                TCGv_i32 tcg_dest = tcg_temp_new_i32(tcg_ctx);
                if (is_signed) {
                    gen_helper_vfp_tosls(tcg_ctx, tcg_dest, tcg_single,
                                         tcg_shift, tcg_fpstatus);
                } else {
                    gen_helper_vfp_touls(tcg_ctx, tcg_dest, tcg_single,
                                         tcg_shift, tcg_fpstatus);
                }
                tcg_gen_extu_i32_i64(tcg_ctx, tcg_int, tcg_dest);
                tcg_temp_free_i32(tcg_ctx, tcg_dest);
            }
            tcg_temp_free_i32(tcg_ctx, tcg_single);
            break;

        case 3: /* float16 */
            tcg_single = read_fp_sreg(s, rn);
            if (sf) {
                if (is_signed) {
                    gen_helper_vfp_tosqh(tcg_ctx, tcg_int, tcg_single,
                                         tcg_shift, tcg_fpstatus);
                } else {
                    gen_helper_vfp_touqh(tcg_ctx, tcg_int, tcg_single,
                                         tcg_shift, tcg_fpstatus);
                }
            } else {
                TCGv_i32 tcg_dest = tcg_temp_new_i32(tcg_ctx);
                if (is_signed) {
                    gen_helper_vfp_toslh(tcg_ctx, tcg_dest, tcg_single,
                                         tcg_shift, tcg_fpstatus);
                } else {
                    gen_helper_vfp_toulh(tcg_ctx, tcg_dest, tcg_single,
                                         tcg_shift, tcg_fpstatus);
                }
                tcg_gen_extu_i32_i64(tcg_ctx, tcg_int, tcg_dest);
                tcg_temp_free_i32(tcg_ctx, tcg_dest);
            }
            tcg_temp_free_i32(tcg_ctx, tcg_single);
            break;

        default:
            g_assert_not_reached();
        }

        gen_helper_set_rmode(tcg_ctx, tcg_rmode, tcg_rmode, tcg_fpstatus);
        tcg_temp_free_i32(tcg_ctx, tcg_rmode);
    }

    tcg_temp_free_ptr(tcg_ctx, tcg_fpstatus);
    tcg_temp_free_i32(tcg_ctx, tcg_shift);
}